

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_sendmsg(int s,nn_msghdr *msghdr,int flags)

{
  nn_fsm_fn p_Var1;
  code *size;
  nn_sock *pnVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  bool bVar6;
  size_t clen;
  uchar *ptr;
  nn_sock *sock;
  nn_cmsghdr *cmsg;
  void *pvStack_a8;
  int nnmsg;
  void *chunk;
  nn_msg msg;
  nn_iovec *iov;
  int i;
  size_t spsz;
  size_t sz;
  int rc;
  int flags_local;
  nn_msghdr *msghdr_local;
  int s_local;
  
  iVar3 = nn_global_hold_socket((nn_sock **)&ptr,s);
  if (iVar3 < 0) {
    piVar4 = __errno_location();
    *piVar4 = -iVar3;
    return -1;
  }
  if (msghdr == (nn_msghdr *)0x0) {
    sz._0_4_ = -0x16;
  }
  else if (msghdr->msg_iovlen < 0) {
    sz._0_4_ = -0x5a;
  }
  else {
    if ((msghdr->msg_iovlen == 1) && (msghdr->msg_iov->iov_len == 0xffffffffffffffff)) {
      pvStack_a8 = *msghdr->msg_iov->iov_base;
      if (pvStack_a8 == (void *)0x0) {
        sz._0_4_ = -0xe;
        goto LAB_00112335;
      }
      spsz = nn_chunk_size(pvStack_a8);
      nn_msg_init_chunk((nn_msg *)&chunk,pvStack_a8);
      cmsg._4_4_ = 1;
    }
    else {
      spsz = 0;
      for (iov._4_4_ = 0; iov._4_4_ != msghdr->msg_iovlen; iov._4_4_ = iov._4_4_ + 1) {
        msg.body.u._24_8_ = msghdr->msg_iov + iov._4_4_;
        if (((nn_iovec *)msg.body.u._24_8_)->iov_len == 0xffffffffffffffff) {
          sz._0_4_ = -0x16;
          goto LAB_00112335;
        }
        bVar6 = false;
        if (((nn_iovec *)msg.body.u._24_8_)->iov_base == (void *)0x0) {
          bVar6 = ((nn_iovec *)msg.body.u._24_8_)->iov_len != 0;
        }
        if (bVar6) {
          sz._0_4_ = -0xe;
          goto LAB_00112335;
        }
        if (spsz + ((nn_iovec *)msg.body.u._24_8_)->iov_len < spsz) {
          sz._0_4_ = -0x16;
          goto LAB_00112335;
        }
        spsz = ((nn_iovec *)msg.body.u._24_8_)->iov_len + spsz;
      }
      nn_msg_init((nn_msg *)&chunk,spsz);
      spsz = 0;
      for (iov._4_4_ = 0; iov._4_4_ != msghdr->msg_iovlen; iov._4_4_ = iov._4_4_ + 1) {
        msg.body.u._24_8_ = msghdr->msg_iov + iov._4_4_;
        pvVar5 = nn_chunkref_data((nn_chunkref *)((long)&msg.hdrs.u + 0x18));
        memcpy((void *)((long)pvVar5 + spsz),*msg.body.u._24_8_,*(size_t *)(msg.body.u._24_8_ + 8));
        spsz = *(long *)(msg.body.u._24_8_ + 8) + spsz;
      }
      cmsg._4_4_ = 0;
    }
    if (msghdr->msg_control != (void *)0x0) {
      if (msghdr->msg_controllen == 0xffffffffffffffff) {
        pvStack_a8 = *msghdr->msg_control;
        nn_chunkref_term((nn_chunkref *)((long)&msg.sphdr.u + 0x18));
        nn_chunkref_init_chunk((nn_chunkref *)((long)&msg.sphdr.u + 0x18),pvStack_a8);
      }
      else {
        nn_chunkref_term((nn_chunkref *)((long)&msg.sphdr.u + 0x18));
        nn_chunkref_init((nn_chunkref *)((long)&msg.sphdr.u + 0x18),msghdr->msg_controllen);
        pvVar5 = nn_chunkref_data((nn_chunkref *)((long)&msg.sphdr.u + 0x18));
        memcpy(pvVar5,msghdr->msg_control,msghdr->msg_controllen);
      }
      for (sock = (nn_sock *)nn_cmsg_nxthdr_(msghdr,(nn_cmsghdr *)0x0); pnVar2 = sock,
          sock != (nn_sock *)0x0; sock = (nn_sock *)nn_cmsg_nxthdr_(msghdr,(nn_cmsghdr *)sock)) {
        if ((*(int *)&(sock->fsm).shutdown_fn == 1) &&
           (*(int *)((long)&(sock->fsm).shutdown_fn + 4) == 1)) {
          p_Var1 = (sock->fsm).fn;
          if (((code *)0x8 < p_Var1 + -0x10) &&
             (size = *(code **)&(sock->fsm).state, size <= p_Var1 + -0x18)) {
            nn_chunkref_term((nn_chunkref *)&chunk);
            nn_chunkref_init((nn_chunkref *)&chunk,(size_t)size);
            pvVar5 = nn_chunkref_data((nn_chunkref *)&chunk);
            memcpy(pvVar5,&(pnVar2->fsm).srcptr,(size_t)size);
          }
          break;
        }
      }
    }
    sz._0_4_ = nn_sock_send((nn_sock *)ptr,(nn_msg *)&chunk,flags);
    if (-1 < (int)sz) {
      nn_sock_stat_increment((nn_sock *)ptr,0x12d,1);
      nn_sock_stat_increment((nn_sock *)ptr,0x12f,spsz);
      nn_global_rele_socket((nn_sock *)ptr);
      return (int)spsz;
    }
    if (cmsg._4_4_ != 0) {
      nn_chunkref_init((nn_chunkref *)((long)&msg.hdrs.u + 0x18),0);
    }
    nn_msg_term((nn_msg *)&chunk);
  }
LAB_00112335:
  nn_global_rele_socket((nn_sock *)ptr);
  piVar4 = __errno_location();
  *piVar4 = -(int)sz;
  return -1;
}

Assistant:

int nn_sendmsg (int s, const struct nn_msghdr *msghdr, int flags)
{
    int rc;
    size_t sz;
    size_t spsz;
    int i;
    struct nn_iovec *iov;
    struct nn_msg msg;
    void *chunk;
    int nnmsg;
    struct nn_cmsghdr *cmsg;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!msghdr)) {
        rc = -EINVAL;
        goto fail;
    }

    if (nn_slow (msghdr->msg_iovlen < 0)) {
        rc = -EMSGSIZE;
        goto fail;
    }

    if (msghdr->msg_iovlen == 1 && msghdr->msg_iov [0].iov_len == NN_MSG) {
        chunk = *(void**) msghdr->msg_iov [0].iov_base;
        if (nn_slow (chunk == NULL)) {
            rc = -EFAULT;
            goto fail;
        }
        sz = nn_chunk_size (chunk);
        nn_msg_init_chunk (&msg, chunk);
        nnmsg = 1;
    }
    else {

        /*  Compute the total size of the message. */
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            if (nn_slow (iov->iov_len == NN_MSG)) {
               rc = -EINVAL;
               goto fail;
            }
            if (nn_slow (!iov->iov_base && iov->iov_len)) {
                rc = -EFAULT;
                goto fail;
            }
            if (nn_slow (sz + iov->iov_len < sz)) {
                rc = -EINVAL;
                goto fail;
            }
            sz += iov->iov_len;
        }

        /*  Create a message object from the supplied scatter array. */
        nn_msg_init (&msg, sz);
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            memcpy (((uint8_t*) nn_chunkref_data (&msg.body)) + sz,
                iov->iov_base, iov->iov_len);
            sz += iov->iov_len;
        }

        nnmsg = 0;
    }

    /*  Add ancillary data to the message. */
    if (msghdr->msg_control) {

        /*  Copy all headers. */
        /*  TODO: SP_HDR should not be copied here! */
        if (msghdr->msg_controllen == NN_MSG) {
            chunk = *((void**) msghdr->msg_control);
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init_chunk (&msg.hdrs, chunk);
        }
        else {
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init (&msg.hdrs, msghdr->msg_controllen);
            memcpy (nn_chunkref_data (&msg.hdrs),
                msghdr->msg_control, msghdr->msg_controllen);
        }

        /* Search for SP_HDR property. */
        cmsg = NN_CMSG_FIRSTHDR (msghdr);
        while (cmsg) {
            if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR) {
                unsigned char *ptr = NN_CMSG_DATA (cmsg);
                size_t clen = cmsg->cmsg_len - NN_CMSG_SPACE (0);
                if (clen > sizeof (size_t)) {
                    spsz = *(size_t *)(void *)ptr;
                    if (spsz <= (clen - sizeof (size_t))) {
                        /*  Copy body of SP_HDR property into 'sphdr'. */
                        nn_chunkref_term (&msg.sphdr);
                        nn_chunkref_init (&msg.sphdr, spsz);
                         memcpy (nn_chunkref_data (&msg.sphdr),
                             ptr + sizeof (size_t), spsz);
                    }
                }
                break;
            }
            cmsg = NN_CMSG_NXTHDR (msghdr, cmsg);
        }
    }

    /*  Send it further down the stack. */
    rc = nn_sock_send (sock, &msg, flags);
    if (nn_slow (rc < 0)) {

        /*  If we are dealing with user-supplied buffer, detach it from
            the message object. */
        if (nnmsg)
            nn_chunkref_init (&msg.body, 0);

        nn_msg_term (&msg);
        goto fail;
    }

    /*  Adjust the statistics. */
    nn_sock_stat_increment (sock, NN_STAT_MESSAGES_SENT, 1);
    nn_sock_stat_increment (sock, NN_STAT_BYTES_SENT, sz);

    nn_global_rele_socket (sock);

    return (int) sz;

fail:
    nn_global_rele_socket (sock);

    errno = -rc;
    return -1;
}